

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_a877::GammaDivisionModule::Run
          (GammaDivisionModule *this,vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output,Buffer *frequency_transform_buffer)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  size_type __new_size;
  
  pdVar2 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (long)this->num_order_ + 1;
  if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != __new_size) {
    std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
    pdVar2 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  pdVar3 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = *pdVar3;
  pdVar1 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    pdVar2 = pdVar2 + 1;
    pdVar3 = pdVar3 + 1;
    if (pdVar3 == pdVar1) break;
    *pdVar2 = *pdVar3 / this->gamma_;
  }
  return true;
}

Assistant:

bool Run(const std::vector<double>& input, std::vector<double>* output,
           sptk::FrequencyTransform::Buffer* frequency_transform_buffer)
      const override {
    if (output->size() != static_cast<std::size_t>(num_order_ + 1)) {
      output->resize(num_order_ + 1);
    }
    // c[0] is not changed
    *(output->begin()) = *(input.begin());
    // c[1-m] /= g
    std::transform(++(input.begin()), input.end(), ++(output->begin()),
                   [this](double c) { return c / gamma_; });
    return true;
  }